

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x22];
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x23];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x24];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = vtt[0x25];
  *(void **)&(this->super_IfcSpatialStructureElement).field_0x158 = vtt[0x26];
  std::__cxx11::string::~string((string *)&(this->super_IfcSpatialStructureElement).field_0x168);
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,vtt + 1);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}